

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O3

bool __thiscall
kj::anon_unknown_9::DiskHandle::tryReplaceNode
          (DiskHandle *this,PathPtr path,WriteMode mode,Function<int_(kj::StringPtr)> *tryCreate)

{
  Iface *pIVar1;
  PathPtr finalName;
  size_t sVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  PathPtr PVar7;
  StringPtr toPath;
  StringPtr fromPath;
  String tempPath;
  String filename;
  Fault f_2;
  PathPtr local_a8;
  String local_98;
  String local_78;
  Function<int_(kj::StringPtr)> local_58;
  Function<int_(kj::StringPtr)> local_48;
  Fault local_38;
  
  local_a8.parts.size_ = path.parts.size_;
  local_a8.parts.ptr = path.parts.ptr;
  if (local_a8.parts.size_ == 0) {
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[19]>
              ((Fault *)&local_78,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
               ,0x3b2,FAILED,(char *)0x0,"\"can\'t replace self\"",
               (char (*) [19])"can\'t replace self");
    _::Debug::Fault::~Fault((Fault *)&local_78);
    return false;
  }
  PathPtr::toString(&local_78,&local_a8,false);
  if ((mode & CREATE) == 0) {
LAB_001f1d03:
    finalName.parts.size_ = local_a8.parts.size_;
    finalName.parts.ptr = local_a8.parts.ptr;
    local_58.impl.disposer = (tryCreate->impl).disposer;
    local_58.impl.ptr = (tryCreate->impl).ptr;
    (tryCreate->impl).ptr = (Iface *)0x0;
    createNamedTemporary(&local_98,this,finalName,mode,&local_58);
    pIVar1 = local_58.impl.ptr;
    if (local_58.impl.ptr != (Iface *)0x0) {
      local_58.impl.ptr = (Iface *)0x0;
      (**(local_58.impl.disposer)->_vptr_Disposer)
                (local_58.impl.disposer,pIVar1->_vptr_Iface[-2] + (long)&pIVar1->_vptr_Iface);
    }
    pcVar5 = "";
    if (local_78.content.size_ != 0) {
      pcVar5 = local_78.content.ptr;
    }
    toPath.content.size_ = local_78.content.size_ + (local_78.content.size_ == 0);
    pcVar6 = "";
    if (local_98.content.size_ != 0) {
      pcVar6 = local_98.content.ptr;
    }
    fromPath.content.size_ = local_98.content.size_ + (local_98.content.size_ == 0);
    toPath.content.ptr = pcVar5;
    fromPath.content.ptr = pcVar6;
    bVar3 = tryCommitReplacement(this,toPath,(this->fd).fd,fromPath,mode,(int *)0x0);
    if (!bVar3) {
      do {
        pcVar5 = "";
        if (local_98.content.size_ != 0) {
          pcVar5 = local_98.content.ptr;
        }
        iVar4 = unlinkat((this->fd).fd,pcVar5,0);
        if (-1 < iVar4) goto LAB_001f1deb;
        iVar4 = _::Debug::getOsErrorNumber(false);
      } while (iVar4 == -1);
      if ((iVar4 != 0) && (iVar4 != 2)) {
        _::Debug::Fault::Fault<int,kj::String&>
                  (&local_38,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                   ,0x3de,iVar4,"unlinkat(fd, tempPath, 0)","tempPath",&local_98);
        _::Debug::Fault::fatal(&local_38);
      }
    }
LAB_001f1deb:
    sVar2 = local_98.content.size_;
    pcVar5 = local_98.content.ptr;
    if (local_98.content.ptr != (char *)0x0) {
      local_98.content.ptr = (char *)0x0;
      local_98.content.size_ = 0;
      (**(local_98.content.disposer)->_vptr_ArrayDisposer)
                (local_98.content.disposer,pcVar5,1,sVar2,sVar2,0);
    }
    goto LAB_001f1f94;
  }
  do {
    pcVar5 = "";
    if (local_78.content.size_ != 0) {
      pcVar5 = local_78.content.ptr;
    }
    pIVar1 = (tryCreate->impl).ptr;
    iVar4 = (**pIVar1->_vptr_Iface)
                      (pIVar1,pcVar5,local_78.content.size_ + (local_78.content.size_ == 0));
    bVar3 = true;
    if (-1 < iVar4) goto LAB_001f1f94;
    iVar4 = _::Debug::getOsErrorNumber(false);
  } while (iVar4 == -1);
  if (iVar4 == 0) goto LAB_001f1f94;
  if (iVar4 == 2) {
    if (((mode & CREATE_PARENT) != 0) && (local_a8.parts.size_ != 0)) {
      PVar7 = PathPtr::parent(&local_a8);
      bVar3 = tryMkdir(this,PVar7,CREATE_PARENT|MODIFY|CREATE,true);
      if (bVar3) {
        PVar7.parts.size_ = local_a8.parts.size_;
        PVar7.parts.ptr = local_a8.parts.ptr;
        local_48.impl.disposer = (tryCreate->impl).disposer;
        local_48.impl.ptr = (tryCreate->impl).ptr;
        (tryCreate->impl).ptr = (Iface *)0x0;
        bVar3 = tryReplaceNode(this,PVar7,mode & ~CREATE_PARENT,&local_48);
        pIVar1 = local_48.impl.ptr;
        if (local_48.impl.ptr != (Iface *)0x0) {
          local_48.impl.ptr = (Iface *)0x0;
          (**(local_48.impl.disposer)->_vptr_Disposer)
                    (local_48.impl.disposer,pIVar1->_vptr_Iface[-2] + (long)&pIVar1->_vptr_Iface);
        }
        goto LAB_001f1f94;
      }
    }
LAB_001f1f57:
    _::Debug::Fault::Fault<int,kj::PathPtr&>
              ((Fault *)&local_98,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
               ,0x3cb,iVar4,"create(path)","path",&local_a8);
    _::Debug::Fault::~Fault((Fault *)&local_98);
  }
  else {
    if (iVar4 != 0x11) goto LAB_001f1f57;
    if ((mode & MODIFY) != 0) goto LAB_001f1d03;
  }
  bVar3 = false;
LAB_001f1f94:
  sVar2 = local_78.content.size_;
  pcVar5 = local_78.content.ptr;
  if (local_78.content.ptr != (char *)0x0) {
    local_78.content.ptr = (char *)0x0;
    local_78.content.size_ = 0;
    (**(local_78.content.disposer)->_vptr_ArrayDisposer)
              (local_78.content.disposer,pcVar5,1,sVar2,sVar2,0);
  }
  return bVar3;
}

Assistant:

bool tryReplaceNode(PathPtr path, WriteMode mode, Function<int(StringPtr)> tryCreate) const {
    // Replaces the given path with an object created by calling tryCreate().
    //
    // tryCreate() must behave like a syscall which creates the node at the path passed to it,
    // returning a negative value on error. If the path passed to tryCreate already exists, it
    // MUST fail with EEXIST.
    //
    // When `mode` includes MODIFY, replaceNode() reacts to EEXIST by creating the node in a
    // temporary location and then rename()ing it into place.

    if (path.size() == 0) {
      KJ_FAIL_REQUIRE("can't replace self") { return false; }
    }

    auto filename = path.toString();

    if (has(mode, WriteMode::CREATE)) {
      // First try just creating the node in-place.
      KJ_SYSCALL_HANDLE_ERRORS(tryCreate(filename)) {
        case EEXIST:
          // Target exists.
          if (has(mode, WriteMode::MODIFY)) {
            // Fall back to MODIFY path, below.
            break;
          } else {
            return false;
          }
        case ENOENT:
          if (has(mode, WriteMode::CREATE_PARENT) && path.size() > 0 &&
              tryMkdir(path.parent(), WriteMode::CREATE | WriteMode::MODIFY |
                                      WriteMode::CREATE_PARENT, true)) {
            // Retry, but make sure we don't try to create the parent again.
            return tryReplaceNode(path, mode - WriteMode::CREATE_PARENT, kj::mv(tryCreate));
          }
          KJ_FALLTHROUGH;
        default:
          KJ_FAIL_SYSCALL("create(path)", error, path) { return false; }
      } else {
        // Success.
        return true;
      }
    }

    // Either we don't have CREATE mode or the target already exists. We need to perform a
    // replacement instead.

    auto tempPath = createNamedTemporary(path, mode, kj::mv(tryCreate));
    if (tryCommitReplacement(filename, fd, tempPath, mode)) {
      return true;
    } else {
      KJ_SYSCALL_HANDLE_ERRORS(unlinkat(fd, tempPath.cStr(), 0)) {
        case ENOENT:
          // meh
          break;
        default:
          KJ_FAIL_SYSCALL("unlinkat(fd, tempPath, 0)", error, tempPath);
      }
      return false;
    }
  }